

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_exception_primitive_ensure
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_stackFrameCleanupRecord_t cleanUpRecord;
  sysbvm_tuple_t local_78;
  sysbvm_stackFrameRecord_t local_70;
  sysbvm_tuple_t local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 1;
  puStack_40 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
  local_60 = arguments[1];
  sysbvm_stackFrame_pushRecord(&local_70);
  local_78 = sysbvm_function_apply(context,*arguments,0,(sysbvm_tuple_t *)0x0,0);
  sysbvm_stackFrame_popRecord(&local_70);
  sysbvm_function_apply(context,local_60,0,(sysbvm_tuple_t *)0x0,0);
  sysbvm_stackFrame_popRecord(&local_58);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_ensure(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *body = arguments + 0;
    sysbvm_tuple_t *block = arguments + 1;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameCleanupRecord_t cleanUpRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP,
        .action = *block,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    gcFrame.result = sysbvm_function_apply0(context, *body);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    sysbvm_function_apply0(context, cleanUpRecord.action);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}